

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O2

void maxPoolingInit(pBox *pbox,pBox *Matrix,int kernelSize,int stride,int flag)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  mydataFmt *__s;
  ostream *poVar4;
  size_t __size;
  float __x;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  float local_38;
  
  fVar7 = (float)stride;
  uVar1 = pbox->width;
  uVar2 = pbox->height;
  auVar5._0_4_ = (float)(uVar1 - kernelSize);
  auVar5._4_4_ = (float)(uVar2 - kernelSize);
  auVar5._8_8_ = 0;
  auVar6._4_4_ = fVar7;
  auVar6._0_4_ = fVar7;
  auVar6._8_4_ = fVar7;
  auVar6._12_4_ = fVar7;
  auVar6 = divps(auVar5,auVar6);
  fVar7 = auVar6._0_4_ + 1.0;
  __x = auVar6._4_4_ + 1.0;
  if (flag == 1) {
    local_38 = floorf(fVar7);
    fVar7 = floorf(__x);
  }
  else {
    local_38 = ceilf(fVar7);
    fVar7 = ceilf(__x);
  }
  Matrix->width = (int)local_38;
  Matrix->height = (int)fVar7;
  iVar3 = pbox->channel;
  Matrix->channel = iVar3;
  __size = (long)((int)fVar7 * (int)local_38 * iVar3) << 2;
  __s = (mydataFmt *)malloc(__size);
  Matrix->pdata = __s;
  if (__s == (mydataFmt *)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"the maxPoolingI nit is failed!!");
    std::endl<char,std::char_traits<char>>(poVar4);
    __s = Matrix->pdata;
    __size = (long)Matrix->height * (long)Matrix->width * (long)Matrix->channel * 4;
  }
  memset(__s,0,__size);
  return;
}

Assistant:

void maxPoolingInit(const pBox *pbox, pBox *Matrix, int kernelSize, int stride, int flag) {
    if (flag == 1) {
        Matrix->width = floor((float) (pbox->width - kernelSize) / stride + 1);
        Matrix->height = floor((float) (pbox->height - kernelSize) / stride + 1);
    } else {
        Matrix->width = ceil((float) (pbox->width - kernelSize) / stride + 1);
        Matrix->height = ceil((float) (pbox->height - kernelSize) / stride + 1);
    }
    Matrix->channel = pbox->channel;
    Matrix->pdata = (mydataFmt *) malloc(Matrix->channel * Matrix->width * Matrix->height * sizeof(mydataFmt));
    if (Matrix->pdata == NULL)cout << "the maxPoolingI nit is failed!!" << endl;
    memset(Matrix->pdata, 0, Matrix->channel * Matrix->width * Matrix->height * sizeof(mydataFmt));
}